

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O3

void __thiscall
kratos::DeadCodeVarElimination::~DeadCodeVarElimination(DeadCodeVarElimination *this)

{
  (this->super_IRVisitor)._vptr_IRVisitor = (_func_int **)&PTR_visit_root_002aab58;
  std::
  _Hashtable<kratos::IRNode_*,_kratos::IRNode_*,_std::allocator<kratos::IRNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::IRNode_*>,_std::hash<kratos::IRNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&(this->super_IRVisitor).visited_._M_h);
  operator_delete(this,0x48);
  return;
}

Assistant:

void visit(Generator* generator) override {
        bool changed = true;

        while (changed) {
            changed = false;
            const auto& var_names = generator->get_vars();
            for (auto const& var_name : var_names) {
                auto const& var = generator->get_var(var_name);
                if (var->type() != VarType::Base) continue;
                if (var->sinks().empty()) {
                    // remove all the sources
                    remove_var(var.get());
                    changed = true;
                    break;
                }
            }
        }

        // because we run child first, the parent's content get cleared out
        // nicely before this pass runs on parent
        clear_out_ports(generator);
    }